

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_io_tests.cpp
# Opt level: O2

void __thiscall key_io_tests::key_io_valid_parse::test_method(key_io_valid_parse *this)

{
  long lVar1;
  size_type sVar2;
  CScript *pCVar3;
  bool bVar4;
  bool bVar5;
  UniValue *pUVar6;
  UniValue *pUVar7;
  string *psVar8;
  optional<ChainType> oVar9;
  long lVar10;
  uint uVar11;
  byte bVar12;
  iterator in_R8;
  iterator pvVar13;
  iterator in_R9;
  iterator pvVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  string_view jsondata;
  const_string file;
  string_view hex_str;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  const_string file_06;
  const_string file_07;
  Span<const_unsigned_char> s_01;
  Span<const_unsigned_char> s_02;
  const_string file_08;
  string_view chain;
  string *in_stack_fffffffffffffc00;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  vector<std::byte,_std::allocator<std::byte>_> exp_payload;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  CKey privkey;
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  undefined **local_198;
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  local_190;
  undefined1 *local_188;
  undefined8 local_180;
  CScript script;
  string exp_base58string;
  string strTest;
  CTxDestination destination;
  UniValue tests;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  jsondata._M_str = json_tests::detail_key_io_valid_bytes;
  jsondata._M_len = 0x42b5;
  read_json(&tests,jsondata);
  privkey.fCompressed = false;
  privkey.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )0x0;
  destination.
  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ._M_u._16_8_ = 0;
  destination.
  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ._M_u._24_8_ = 0;
  destination.
  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ._M_u._0_8_ = 0;
  destination.
  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ._M_u._8_8_ = 0;
  destination.
  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  .
  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ._M_index = '\0';
  SelectParams(MAIN);
  uVar11 = 0;
  do {
    if ((ulong)(((long)tests.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)tests.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x58) <= (ulong)uVar11) {
      std::__detail::__variant::
      _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                           *)&destination);
      std::
      unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      ::~unique_ptr(&privkey.keydata);
      UniValue::~UniValue(&tests);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
LAB_0036064a:
      __stack_chk_fail();
    }
    pUVar6 = UniValue::operator[](&tests,(ulong)uVar11);
    UniValue::write_abi_cxx11_((UniValue *)&strTest,(int)pUVar6,(void *)0x0,0);
    if ((ulong)(((long)(pUVar6->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(pUVar6->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x58) < 3) {
      local_1f8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
      ;
      local_1f0 = "";
      local_208 = &boost::unit_test::basic_cstring<char_const>::null;
      local_200 = &boost::unit_test::basic_cstring<char_const>::null;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      file.m_end = (iterator)0x23;
      file.m_begin = (iterator)&local_1f8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_208,msg)
      ;
      script.super_CScriptBase._union.direct[0] = '\0';
      script.super_CScriptBase._union._8_8_ = 0;
      script.super_CScriptBase._union._16_8_ = 0;
      exp_base58string._M_string_length._0_1_ = 0;
      exp_base58string._M_dataplus._M_p = "<W\x1b";
      exp_base58string.field_2._M_allocated_capacity =
           (size_type)boost::unit_test::lazy_ostream::inst;
      exp_base58string.field_2._8_8_ = anon_var_dwarf_26187a;
      local_190._M_t.
      super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl._0_1_ = '\0';
      local_198 = &PTR__lazy_ostream_01139a98;
      local_188 = (undefined1 *)&exp_base58string;
      local_180 = &strTest;
      local_218 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
      ;
      local_210 = "";
      in_R8 = &DAT_00000001;
      in_R9 = &DAT_00000001;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&script,(lazy_ostream *)&local_198,1,1,WARN,
                 (check_type)in_stack_fffffffffffffc00,(size_t)&local_218,0x23);
      boost::detail::shared_count::~shared_count
                ((shared_count *)((long)&script.super_CScriptBase._union + 0x10));
    }
    else {
      pUVar7 = UniValue::operator[](pUVar6,0);
      psVar8 = UniValue::get_str_abi_cxx11_(pUVar7);
      std::__cxx11::string::string((string *)&exp_base58string,psVar8);
      pUVar7 = UniValue::operator[](pUVar6,1);
      psVar8 = UniValue::get_str_abi_cxx11_(pUVar7);
      hex_str._M_str = (psVar8->_M_dataplus)._M_p;
      hex_str._M_len = psVar8->_M_string_length;
      ParseHex<std::byte>(&exp_payload,hex_str);
      pUVar6 = UniValue::operator[](pUVar6,2);
      pUVar6 = UniValue::get_obj(pUVar6);
      key._M_str = "isPrivkey";
      key._M_len = 9;
      pUVar7 = UniValue::find_value(pUVar6,key);
      bVar4 = UniValue::get_bool(pUVar7);
      key_00._M_str = "chain";
      key_00._M_len = 5;
      pUVar7 = UniValue::find_value(pUVar6,key_00);
      psVar8 = UniValue::get_str_abi_cxx11_(pUVar7);
      chain._M_str = (psVar8->_M_dataplus)._M_p;
      chain._M_len = psVar8->_M_string_length;
      oVar9 = ChainTypeFromString(chain);
      if (((ulong)oVar9.super__Optional_base<ChainType,_true,_true>._M_payload.
                  super__Optional_payload_base<ChainType> >> 0x20 & 1) == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          std::__throw_bad_optional_access();
        }
        goto LAB_0036064a;
      }
      SelectParams(oVar9.super__Optional_base<ChainType,_true,_true>._M_payload.
                   super__Optional_payload_base<ChainType>._M_payload);
      key_01._M_str = "tryCaseFlip";
      key_01._M_len = 0xb;
      pUVar7 = UniValue::find_value(pUVar6,key_01);
      if (pUVar7->typ == VNULL) {
        bVar5 = false;
      }
      else {
        key_02._M_str = "tryCaseFlip";
        key_02._M_len = 0xb;
        pUVar7 = UniValue::find_value(pUVar6,key_02);
        bVar5 = UniValue::get_bool(pUVar7);
      }
      if (bVar4) {
        key_03._M_str = "isCompressed";
        key_03._M_len = 0xc;
        pUVar6 = UniValue::find_value(pUVar6,key_03);
        bVar4 = UniValue::get_bool(pUVar6);
        DecodeSecret((string *)&local_198);
        CKey::operator=(&privkey,(CKey *)&local_198);
        std::
        unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        ::~unique_ptr(&local_190);
        local_240 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
        ;
        local_238 = "";
        local_250 = &boost::unit_test::basic_cstring<char_const>::null;
        local_248 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_00.m_end = in_R9;
        msg_00.m_begin = in_R8;
        file_00.m_end = (iterator)0x30;
        file_00.m_begin = (iterator)&local_240;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_250
                   ,msg_00);
        local_1b8._M_dataplus._M_p._0_1_ =
             (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
              )privkey.keydata._M_t.
               super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
             (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
              )0x0;
        local_1b8._M_string_length = 0;
        local_1b8.field_2._M_allocated_capacity = 0;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&script,
                       "!IsValid:",&strTest);
        local_190._M_t.
        super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl._0_1_ = '\0';
        local_198 = &PTR__lazy_ostream_01139e30;
        local_188 = boost::unit_test::lazy_ostream::inst;
        local_260 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
        ;
        local_258 = "";
        pvVar13 = &DAT_00000001;
        pvVar14 = &DAT_00000001;
        local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&script;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&local_1b8,(lazy_ostream *)&local_198,1,1,WARN,
                   (check_type)in_stack_fffffffffffffc00,(size_t)&local_260,0x30);
        std::__cxx11::string::~string((string *)&script);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)&local_1b8.field_2._M_allocated_capacity);
        local_270 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
        ;
        local_268 = "";
        local_280 = &boost::unit_test::basic_cstring<char_const>::null;
        local_278 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_01.m_end = pvVar14;
        msg_01.m_begin = pvVar13;
        file_01.m_end = (iterator)0x31;
        file_01.m_begin = (iterator)&local_270;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_280
                   ,msg_01);
        local_1b8._M_dataplus._M_p._0_1_ = bVar4 ^ privkey.fCompressed ^ 1;
        local_1b8._M_string_length = 0;
        local_1b8.field_2._M_allocated_capacity = 0;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&script,
                       "compressed mismatch:",&strTest);
        local_190._M_t.
        super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl._0_1_ = '\0';
        local_198 = &PTR__lazy_ostream_01139e30;
        local_188 = boost::unit_test::lazy_ostream::inst;
        local_290 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
        ;
        local_288 = "";
        pvVar13 = &DAT_00000001;
        pvVar14 = &DAT_00000001;
        local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&script;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&local_1b8,(lazy_ostream *)&local_198,1,1,WARN,
                   (check_type)in_stack_fffffffffffffc00,(size_t)&local_290,0x31);
        std::__cxx11::string::~string((string *)&script);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)&local_1b8.field_2._M_allocated_capacity);
        local_2a0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
        ;
        local_298 = "";
        local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_02.m_end = pvVar14;
        msg_02.m_begin = pvVar13;
        file_02.m_end = &DAT_00000032;
        file_02.m_begin = (iterator)&local_2a0;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2b0
                   ,msg_02);
        local_1b8._M_dataplus._M_p._0_1_ =
             std::ranges::__equal_fn::
             operator()<CKey_&,_const_std::vector<std::byte,_std::allocator<std::byte>_>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                       ((__equal_fn *)&std::ranges::equal,&privkey,&exp_payload);
        local_1b8._M_string_length = 0;
        local_1b8.field_2._M_allocated_capacity = 0;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&script,
                       "key mismatch:",&strTest);
        local_190._M_t.
        super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl._0_1_ = '\0';
        local_198 = &PTR__lazy_ostream_01139e30;
        local_188 = boost::unit_test::lazy_ostream::inst;
        local_2c0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
        ;
        local_2b8 = "";
        pvVar13 = &DAT_00000001;
        pvVar14 = &DAT_00000001;
        local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&script;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&local_1b8,(lazy_ostream *)&local_198,1,1,WARN,
                   (check_type)in_stack_fffffffffffffc00,(size_t)&local_2c0,0x32);
        std::__cxx11::string::~string((string *)&script);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)&local_1b8.field_2._M_allocated_capacity);
        DecodeDestination((CTxDestination *)&local_198,&exp_base58string);
        std::__detail::__variant::
        _Move_assign_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::operator=((_Move_assign_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)&destination,
                    (_Move_assign_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)&local_198);
        std::__detail::__variant::
        _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)&local_198);
        local_2d0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
        ;
        local_2c8 = "";
        local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_03.m_end = pvVar14;
        msg_03.m_begin = pvVar13;
        file_03.m_end = (iterator)0x36;
        file_03.m_begin = (iterator)&local_2d0;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2e0
                   ,msg_03);
        bVar4 = IsValidDestination(&destination);
        local_1b8._M_dataplus._M_p._0_1_ = !bVar4;
        local_1b8._M_string_length = 0;
        local_1b8.field_2._M_allocated_capacity = 0;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&script,
                       "IsValid privkey as pubkey:",&strTest);
        local_190._M_t.
        super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl._0_1_ = '\0';
        local_198 = &PTR__lazy_ostream_01139e30;
        local_188 = boost::unit_test::lazy_ostream::inst;
        local_2f0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
        ;
        local_2e8 = "";
        in_R8 = &DAT_00000001;
        in_R9 = &DAT_00000001;
        local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&script;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&local_1b8,(lazy_ostream *)&local_198,1,1,WARN,
                   (check_type)in_stack_fffffffffffffc00,(size_t)&local_2f0,0x36);
        std::__cxx11::string::~string((string *)&script);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)&local_1b8.field_2._M_allocated_capacity);
      }
      else {
        DecodeDestination((CTxDestination *)&local_198,&exp_base58string);
        std::__detail::__variant::
        _Move_assign_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::operator=((_Move_assign_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)&destination,
                    (_Move_assign_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)&local_198);
        std::__detail::__variant::
        _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)&local_198);
        GetScriptForDestination(&script,&destination);
        local_300 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
        ;
        local_2f8 = "";
        local_310 = &boost::unit_test::basic_cstring<char_const>::null;
        local_308 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_04.m_end = in_R9;
        msg_04.m_begin = in_R8;
        file_04.m_end = (iterator)0x3b;
        file_04.m_begin = (iterator)&local_300;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_310
                   ,msg_04);
        local_1d8._M_dataplus._M_p._0_1_ = IsValidDestination(&destination);
        local_1d8._M_string_length = 0;
        local_1d8.field_2._M_allocated_capacity = 0;
        std::operator+(&local_1b8,"!IsValid:",&strTest);
        local_190._M_t.
        super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl._0_1_ = '\0';
        local_198 = &PTR__lazy_ostream_01139e30;
        local_188 = boost::unit_test::lazy_ostream::inst;
        local_320 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
        ;
        local_318 = "";
        pvVar13 = &DAT_00000001;
        pvVar14 = &DAT_00000001;
        local_180 = &local_1b8;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&local_1d8,(lazy_ostream *)&local_198,1,1,WARN,
                   (check_type)in_stack_fffffffffffffc00,(size_t)&local_320,0x3b);
        std::__cxx11::string::~string((string *)&local_1b8);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)&local_1d8.field_2._M_allocated_capacity);
        local_330 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
        ;
        local_328 = "";
        local_340 = &boost::unit_test::basic_cstring<char_const>::null;
        local_338 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_05.m_end = pvVar14;
        msg_05.m_begin = pvVar13;
        file_05.m_end = (iterator)0x3c;
        file_05.m_begin = (iterator)&local_330;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_340
                   ,msg_05);
        local_190._M_t.
        super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl._0_1_ = '\0';
        local_198 = &PTR__lazy_ostream_01139f30;
        local_188 = boost::unit_test::lazy_ostream::inst;
        local_180 = (long)"\x05\x04\x03\x02\x01" + 5;
        local_350 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
        ;
        local_348 = "";
        sVar2 = script.super_CScriptBase._size - 0x1d;
        pCVar3 = (CScript *)
                 CONCAT71(script.super_CScriptBase._union._1_7_,
                          script.super_CScriptBase._union.direct[0]);
        if (script.super_CScriptBase._size < 0x1d) {
          sVar2 = script.super_CScriptBase._size;
          pCVar3 = &script;
        }
        s.m_size._0_4_ = sVar2;
        s.m_data = (uchar *)pCVar3;
        s.m_size._4_4_ = 0;
        HexStr_abi_cxx11_(&local_1b8,s);
        s_00.m_size = (long)exp_payload.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)exp_payload.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_start;
        s_00.m_data = exp_payload.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_start;
        HexStr_abi_cxx11_(&local_1d8,s_00);
        pvVar13 = (iterator)0x2;
        pbVar15 = &local_1b8;
        in_stack_fffffffffffffc00 = &local_1d8;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                  ((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                    *)&local_198,&local_350,0x3c,1,2,&local_1b8,"HexStr(script)",&local_1d8,
                   "HexStr(exp_payload)");
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_1b8);
        for (lVar10 = 0;
            CONCAT71(exp_base58string._M_string_length._1_7_,
                     (undefined1)exp_base58string._M_string_length) != lVar10; lVar10 = lVar10 + 1)
        {
          bVar12 = exp_base58string._M_dataplus._M_p[lVar10];
          if ((byte)(bVar12 + 0x9f) < 0x1a) {
            bVar12 = bVar12 - 0x20;
LAB_0035ff9a:
            exp_base58string._M_dataplus._M_p[lVar10] = bVar12;
          }
          else if ((byte)(bVar12 + 0xbf) < 0x1a) {
            bVar12 = bVar12 | 0x20;
            goto LAB_0035ff9a;
          }
        }
        DecodeDestination((CTxDestination *)&local_198,&exp_base58string);
        std::__detail::__variant::
        _Move_assign_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::operator=((_Move_assign_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)&destination,
                    (_Move_assign_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)&local_198);
        std::__detail::__variant::
        _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)&local_198);
        local_360 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
        ;
        local_358 = "";
        local_370 = &boost::unit_test::basic_cstring<char_const>::null;
        local_368 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_06.m_end = (iterator)pbVar15;
        msg_06.m_begin = pvVar13;
        file_06.m_end = (iterator)0x47;
        file_06.m_begin = (iterator)&local_360;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_370
                   ,msg_06);
        bVar4 = IsValidDestination(&destination);
        local_1d8._M_dataplus._M_p._0_1_ = bVar5 ^ bVar4 ^ 1;
        local_1d8._M_string_length = 0;
        local_1d8.field_2._M_allocated_capacity = 0;
        std::operator+(&local_1b8,"!IsValid case flipped:",&strTest);
        local_190._M_t.
        super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl._0_1_ = '\0';
        local_198 = &PTR__lazy_ostream_01139e30;
        local_188 = boost::unit_test::lazy_ostream::inst;
        local_380 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
        ;
        local_378 = "";
        pvVar13 = &DAT_00000001;
        pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001
        ;
        local_180 = &local_1b8;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&local_1d8,(lazy_ostream *)&local_198,1,1,WARN,
                   (check_type)in_stack_fffffffffffffc00,(size_t)&local_380,0x47);
        std::__cxx11::string::~string((string *)&local_1b8);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)&local_1d8.field_2._M_allocated_capacity);
        bVar4 = IsValidDestination(&destination);
        if (bVar4) {
          GetScriptForDestination((CScript *)&local_198,&destination);
          prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                    (&script.super_CScriptBase,
                     (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_198);
          prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_198);
          local_390 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
          ;
          local_388 = "";
          local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
          local_398 = &boost::unit_test::basic_cstring<char_const>::null;
          msg_07.m_end = (iterator)pbVar15;
          msg_07.m_begin = pvVar13;
          file_07.m_end = (iterator)0x4a;
          file_07.m_begin = (iterator)&local_390;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,
                     (size_t)&local_3a0,msg_07);
          local_190._M_t.
          super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl._0_1_ = '\0'
          ;
          local_198 = &PTR__lazy_ostream_01139f30;
          local_188 = boost::unit_test::lazy_ostream::inst;
          local_180 = (long)"\x05\x04\x03\x02\x01" + 5;
          local_3b0 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
          ;
          local_3a8 = "";
          sVar2 = script.super_CScriptBase._size - 0x1d;
          pCVar3 = (CScript *)
                   CONCAT71(script.super_CScriptBase._union._1_7_,
                            script.super_CScriptBase._union.direct[0]);
          if (script.super_CScriptBase._size < 0x1d) {
            sVar2 = script.super_CScriptBase._size;
            pCVar3 = &script;
          }
          s_01.m_size._0_4_ = sVar2;
          s_01.m_data = (uchar *)pCVar3;
          s_01.m_size._4_4_ = 0;
          HexStr_abi_cxx11_(&local_1b8,s_01);
          s_02.m_size = (long)exp_payload.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)exp_payload.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start;
          s_02.m_data = exp_payload.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                        _M_impl.super__Vector_impl_data._M_start;
          HexStr_abi_cxx11_(&local_1d8,s_02);
          pvVar13 = (iterator)0x2;
          pbVar15 = &local_1b8;
          in_stack_fffffffffffffc00 = &local_1d8;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                    ((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      *)&local_198,&local_3b0,0x4a,1,2,&local_1b8,"HexStr(script)",&local_1d8,
                     "HexStr(exp_payload)");
          std::__cxx11::string::~string((string *)&local_1d8);
          std::__cxx11::string::~string((string *)&local_1b8);
        }
        DecodeSecret((string *)&local_198);
        CKey::operator=(&privkey,(CKey *)&local_198);
        std::
        unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        ::~unique_ptr(&local_190);
        local_3c0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
        ;
        local_3b8 = "";
        local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_08.m_end = (iterator)pbVar15;
        msg_08.m_begin = pvVar13;
        file_08.m_end = (iterator)0x4f;
        file_08.m_begin = (iterator)&local_3c0;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3d0
                   ,msg_08);
        local_1d8._M_dataplus._M_p._0_1_ =
             (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
              )privkey.keydata._M_t.
               super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl ==
             (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
              )0x0;
        local_1d8._M_string_length = 0;
        local_1d8.field_2._M_allocated_capacity = 0;
        std::operator+(&local_1b8,"IsValid pubkey as privkey:",&strTest);
        local_190._M_t.
        super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl._0_1_ = '\0';
        local_198 = &PTR__lazy_ostream_01139e30;
        local_188 = boost::unit_test::lazy_ostream::inst;
        local_3e0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
        ;
        local_3d8 = "";
        in_R8 = &DAT_00000001;
        in_R9 = &DAT_00000001;
        local_180 = &local_1b8;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&local_1d8,(lazy_ostream *)&local_198,1,1,WARN,
                   (check_type)in_stack_fffffffffffffc00,(size_t)&local_3e0,0x4f);
        std::__cxx11::string::~string((string *)&local_1b8);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)&local_1d8.field_2._M_allocated_capacity);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&script.super_CScriptBase);
      }
      std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
                (&exp_payload.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
      std::__cxx11::string::~string((string *)&exp_base58string);
    }
    std::__cxx11::string::~string((string *)&strTest);
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(key_io_valid_parse)
{
    UniValue tests = read_json(json_tests::key_io_valid);
    CKey privkey;
    CTxDestination destination;
    SelectParams(ChainType::MAIN);

    for (unsigned int idx = 0; idx < tests.size(); idx++) {
        const UniValue& test = tests[idx];
        std::string strTest = test.write();
        if (test.size() < 3) { // Allow for extra stuff (useful for comments)
            BOOST_ERROR("Bad test: " << strTest);
            continue;
        }
        std::string exp_base58string = test[0].get_str();
        const std::vector<std::byte> exp_payload{ParseHex<std::byte>(test[1].get_str())};
        const UniValue &metadata = test[2].get_obj();
        bool isPrivkey = metadata.find_value("isPrivkey").get_bool();
        SelectParams(ChainTypeFromString(metadata.find_value("chain").get_str()).value());
        bool try_case_flip = metadata.find_value("tryCaseFlip").isNull() ? false : metadata.find_value("tryCaseFlip").get_bool();
        if (isPrivkey) {
            bool isCompressed = metadata.find_value("isCompressed").get_bool();
            // Must be valid private key
            privkey = DecodeSecret(exp_base58string);
            BOOST_CHECK_MESSAGE(privkey.IsValid(), "!IsValid:" + strTest);
            BOOST_CHECK_MESSAGE(privkey.IsCompressed() == isCompressed, "compressed mismatch:" + strTest);
            BOOST_CHECK_MESSAGE(std::ranges::equal(privkey, exp_payload), "key mismatch:" + strTest);

            // Private key must be invalid public key
            destination = DecodeDestination(exp_base58string);
            BOOST_CHECK_MESSAGE(!IsValidDestination(destination), "IsValid privkey as pubkey:" + strTest);
        } else {
            // Must be valid public key
            destination = DecodeDestination(exp_base58string);
            CScript script = GetScriptForDestination(destination);
            BOOST_CHECK_MESSAGE(IsValidDestination(destination), "!IsValid:" + strTest);
            BOOST_CHECK_EQUAL(HexStr(script), HexStr(exp_payload));

            // Try flipped case version
            for (char& c : exp_base58string) {
                if (c >= 'a' && c <= 'z') {
                    c = (c - 'a') + 'A';
                } else if (c >= 'A' && c <= 'Z') {
                    c = (c - 'A') + 'a';
                }
            }
            destination = DecodeDestination(exp_base58string);
            BOOST_CHECK_MESSAGE(IsValidDestination(destination) == try_case_flip, "!IsValid case flipped:" + strTest);
            if (IsValidDestination(destination)) {
                script = GetScriptForDestination(destination);
                BOOST_CHECK_EQUAL(HexStr(script), HexStr(exp_payload));
            }

            // Public key must be invalid private key
            privkey = DecodeSecret(exp_base58string);
            BOOST_CHECK_MESSAGE(!privkey.IsValid(), "IsValid pubkey as privkey:" + strTest);
        }
    }
}